

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraint.cpp
# Opt level: O2

ChConstraint * __thiscall chrono::ChConstraint::operator=(ChConstraint *this,ChConstraint *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  
  if (other != this) {
    this->g_i = other->g_i;
    dVar1 = other->l_i;
    dVar2 = other->b_i;
    dVar3 = other->cfm_i;
    this->c_i = other->c_i;
    this->l_i = dVar1;
    this->b_i = dVar2;
    this->cfm_i = dVar3;
    this->active = other->active;
    bVar4 = other->disabled;
    bVar5 = other->redundant;
    bVar6 = other->broken;
    this->valid = other->valid;
    this->disabled = bVar4;
    this->redundant = bVar5;
    this->broken = bVar6;
    this->mode = other->mode;
  }
  return this;
}

Assistant:

ChConstraint& ChConstraint::operator=(const ChConstraint& other) {
    if (&other == this)
        return *this;

    c_i = other.c_i;
    g_i = other.g_i;
    b_i = other.b_i;
    l_i = other.l_i;
    cfm_i = other.cfm_i;
    valid = other.valid;
    active = other.active;
    disabled = other.disabled;
    redundant = other.redundant;
    broken = other.broken;
    mode = other.mode;

    return *this;
}